

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall QSslSocket::setLocalCertificate(QSslSocket *this,QSslCertificate *certificate)

{
  QArrayDataPointer<QSslCertificate> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QSslCertificate> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<QSslCertificate> *)
            (*(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8 + 0x2c0);
  local_38.d = (Data *)0x0;
  local_38.ptr = (QSslCertificate *)0x0;
  local_38.size = 0;
  QArrayDataPointer<QSslCertificate>::operator=(this_00,&local_38);
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_38);
  QList<QSslCertificate>::emplaceBack<QSslCertificate_const&>
            ((QList<QSslCertificate> *)this_00,certificate);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::setLocalCertificate(const QSslCertificate &certificate)
{
    Q_D(QSslSocket);
    d->configuration.localCertificateChain = QList<QSslCertificate>();
    d->configuration.localCertificateChain += certificate;
}